

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_opengl.h
# Opt level: O1

bool djgp_to_gl(djg_program *program,int version,bool compatible,bool link,GLuint *gl)

{
  byte bVar1;
  GLint GVar2;
  GLboolean GVar3;
  bool bVar4;
  GLuint program_00;
  djg_program *it;
  djg_program *pdVar5;
  GLchar **source;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  GLchar *__ptr;
  GLchar **ppGVar9;
  size_t sVar10;
  size_t sVar11;
  byte bVar12;
  int i;
  int count;
  GLint logc;
  char head [4096];
  GLint local_103c;
  uint local_1038 [2];
  char acStack_1030 [7];
  char acStack_1029 [8];
  char acStack_1021 [9];
  undefined2 auStack_1018 [2036];
  
  if ((program == (djg_program *)0x0) || (gl == (GLuint *)0x0)) {
    __assert_fail("program && gl",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/dj_opengl/dj_opengl.h"
                  ,0x1f9,"bool djgp_to_gl(const djg_program *, int, bool, bool, GLuint *)");
  }
  count = 0;
  pdVar5 = program;
  sVar11 = 0;
  do {
    sVar10 = sVar11;
    pdVar5 = pdVar5->next;
    count = count + 1;
    sVar11 = sVar10 + 8;
  } while (pdVar5 != (djg_program *)0x0);
  source = (GLchar **)malloc(sVar11);
  ppGVar9 = source;
  for (pdVar5 = program->next; pdVar5 != (djg_program *)0x0; pdVar5 = pdVar5->next) {
    ppGVar9 = ppGVar9 + 1;
    *ppGVar9 = pdVar5->src;
  }
  pcVar8 = *(char **)((long)source + sVar10);
  pcVar6 = strstr(pcVar8,"VERTEX_SHADER");
  pcVar7 = strstr(pcVar8,"FRAGMENT_SHADER");
  bVar12 = (pcVar6 != (char *)0x0) + 2;
  if (pcVar7 == (char *)0x0) {
    bVar12 = pcVar6 != (char *)0x0;
  }
  pcVar6 = strstr(pcVar8,"GEOMETRY_SHADER");
  bVar1 = bVar12 + 4;
  if (pcVar6 == (char *)0x0) {
    bVar1 = bVar12;
  }
  pcVar6 = strstr(pcVar8,"TESS_CONTROL_SHADER");
  bVar12 = bVar1 + 8;
  if (pcVar6 == (char *)0x0) {
    bVar12 = bVar1;
  }
  pcVar6 = strstr(pcVar8,"TESS_EVALUATION_SHADER");
  bVar1 = bVar12 | 0x10;
  if (pcVar6 == (char *)0x0) {
    bVar1 = bVar12;
  }
  pcVar6 = strstr(pcVar8,"COMPUTE_SHADER");
  bVar12 = bVar1 | 0x80;
  if (pcVar6 == (char *)0x0) {
    bVar12 = bVar1;
  }
  pcVar6 = strstr(pcVar8,"TASK_SHADER");
  bVar1 = bVar12 | 0x20;
  if (pcVar6 == (char *)0x0) {
    bVar1 = bVar12;
  }
  pcVar8 = strstr(pcVar8,"MESH_SHADER");
  bVar12 = bVar1 | 0x40;
  if (pcVar8 == (char *)0x0) {
    bVar12 = bVar1;
  }
  if (bVar12 == 0) {
    pcVar8 = "djg_error: no shader stage found in source\n";
    sVar11 = 0x2b;
  }
  else {
    program_00 = (*glad_glCreateProgram)();
    GVar3 = (*glad_glIsProgram)(program_00);
    if (GVar3 != '\0') {
      if ((bVar12 & 1) == 0) {
LAB_00134e67:
        if ((bVar12 & 2) != 0) {
          local_1038[0] = local_1038[0] & 0xffffff00;
          pcVar8 = "";
          if (compatible) {
            pcVar8 = "compatibility";
          }
          sprintf((char *)local_1038,"#version %d %s\n",(ulong)(uint)version,pcVar8);
          sVar11 = strlen((char *)local_1038);
          builtin_strncpy((char *)((long)local_1038 + sVar11),"#define ",8);
          builtin_strncpy(acStack_1030 + sVar11,"FRAGMENT_SH",0xb);
          builtin_strncpy(acStack_1029 + sVar11 + 4,"ADER 1\n",8);
          *source = (GLchar *)local_1038;
          bVar4 = djgp__attach_shader(program_00,0x8b30,count,source);
          if (!bVar4) goto LAB_0013523c;
        }
        if ((bVar12 & 4) != 0) {
          local_1038[0] = local_1038[0] & 0xffffff00;
          pcVar8 = "";
          if (compatible) {
            pcVar8 = "compatibility";
          }
          sprintf((char *)local_1038,"#version %d %s\n",(ulong)(uint)version,pcVar8);
          sVar11 = strlen((char *)local_1038);
          builtin_strncpy((char *)((long)local_1038 + sVar11),"#define ",8);
          builtin_strncpy(acStack_1030 + sVar11,"GEOMETRY_SH",0xb);
          builtin_strncpy(acStack_1029 + sVar11 + 4,"ADER 1\n",8);
          *source = (GLchar *)local_1038;
          bVar4 = djgp__attach_shader(program_00,0x8dd9,count,source);
          if (!bVar4) goto LAB_0013523c;
        }
        if ((bVar12 & 8) != 0) {
          local_1038[0] = local_1038[0] & 0xffffff00;
          pcVar8 = "";
          if (compatible) {
            pcVar8 = "compatibility";
          }
          sprintf((char *)local_1038,"#version %d %s\n",(ulong)(uint)version,pcVar8);
          sVar11 = strlen((char *)local_1038);
          builtin_strncpy((char *)((long)local_1038 + sVar11),"#define ",8);
          builtin_strncpy(acStack_1030 + sVar11,"TESS_CON",8);
          builtin_strncpy(acStack_1029 + sVar11,"NTROL_SH",8);
          builtin_strncpy(acStack_1021 + sVar11,"ADER 1\n",8);
          *source = (GLchar *)local_1038;
          bVar4 = djgp__attach_shader(program_00,0x8e88,count,source);
          if (!bVar4) goto LAB_0013523c;
        }
        if ((bVar12 & 0x10) != 0) {
          local_1038[0] = local_1038[0] & 0xffffff00;
          pcVar8 = "";
          if (compatible) {
            pcVar8 = "compatibility";
          }
          sprintf((char *)local_1038,"#version %d %s\n",(ulong)(uint)version,pcVar8);
          sVar11 = strlen((char *)local_1038);
          builtin_strncpy((char *)((long)local_1038 + sVar11),"#define ",8);
          builtin_strncpy(acStack_1030 + sVar11,"TESS_EVA",8);
          builtin_strncpy(acStack_1029 + sVar11 + 1,"LUATION_",8);
          builtin_strncpy(acStack_1021 + sVar11 + 1,"SHADER 1",8);
          *(undefined2 *)((long)auStack_1018 + sVar11) = 10;
          *source = (GLchar *)local_1038;
          bVar4 = djgp__attach_shader(program_00,0x8e87,count,source);
          if (!bVar4) goto LAB_0013523c;
        }
        if ((char)bVar12 < '\0') {
          local_1038[0] = local_1038[0] & 0xffffff00;
          pcVar8 = "";
          if (compatible) {
            pcVar8 = "compatibility";
          }
          sprintf((char *)local_1038,"#version %d %s\n",(ulong)(uint)version,pcVar8);
          sVar11 = strlen((char *)local_1038);
          builtin_strncpy((char *)((long)local_1038 + sVar11),"#define ",8);
          builtin_strncpy(acStack_1030 + sVar11,"COMPUTE_SH",10);
          builtin_strncpy(acStack_1029 + sVar11 + 3,"ADER 1\n",8);
          *source = (GLchar *)local_1038;
          bVar4 = djgp__attach_shader(program_00,0x91b9,count,source);
          if (!bVar4) goto LAB_0013523c;
        }
        if ((bVar12 & 0x20) != 0) {
          local_1038[0] = local_1038[0] & 0xffffff00;
          pcVar8 = "";
          if (compatible) {
            pcVar8 = "compatibility";
          }
          sprintf((char *)local_1038,"#version %d %s\n",(ulong)(uint)version,pcVar8);
          sVar11 = strlen((char *)local_1038);
          builtin_strncpy(acStack_1029 + sVar11,"ADER 1\n",8);
          builtin_strncpy((char *)((long)local_1038 + sVar11),"#define ",8);
          builtin_strncpy(acStack_1030 + sVar11,"TASK_SHA",8);
          *source = (GLchar *)local_1038;
          bVar4 = djgp__attach_shader(program_00,0x955a,count,source);
          if (!bVar4) goto LAB_0013523c;
        }
        if ((bVar12 & 0x40) == 0) {
LAB_001351bb:
          if (link) {
            local_1038[0] = 0;
            (*glad_glLinkProgram)(program_00);
            (*glad_glGetProgramiv)(program_00,0x8b82,(GLint *)local_1038);
            if (local_1038[0] == 0) {
              local_103c = 0;
              (*glad_glGetProgramiv)(program_00,0x8b84,&local_103c);
              GVar2 = local_103c;
              __ptr = (GLchar *)malloc((long)local_103c);
              (*glad_glGetProgramInfoLog)(program_00,GVar2,(GLsizei *)0x0,__ptr);
              fprintf(_stdout,
                      "djg_error: GLSL linker failure\n                     -- Begin -- GLSL Linker Info Log\n                     %s\n                     -- End -- GLSL Linker Info Log\n"
                      ,__ptr);
              fflush(_stdout);
              (*glad_glDeleteProgram)(program_00);
              free(__ptr);
              free(source);
              return false;
            }
          }
          free(source);
          GVar3 = (*glad_glIsProgram)(*gl);
          if (GVar3 != '\0') {
            (*glad_glDeleteProgram)(*gl);
          }
          *gl = program_00;
          return true;
        }
        local_1038[0] = local_1038[0] & 0xffffff00;
        pcVar8 = "";
        if (compatible) {
          pcVar8 = "compatibility";
        }
        sprintf((char *)local_1038,"#version %d %s\n",(ulong)(uint)version,pcVar8);
        sVar11 = strlen((char *)local_1038);
        builtin_strncpy(acStack_1029 + sVar11,"ADER 1\n",8);
        builtin_strncpy((char *)((long)local_1038 + sVar11),"#define ",8);
        builtin_strncpy(acStack_1030 + sVar11,"MESH_SHA",8);
        *source = (GLchar *)local_1038;
        bVar4 = djgp__attach_shader(program_00,0x9559,count,source);
        if (bVar4) goto LAB_001351bb;
      }
      else {
        local_1038[0] = local_1038[0] & 0xffffff00;
        pcVar8 = "";
        if (compatible) {
          pcVar8 = "compatibility";
        }
        sprintf((char *)local_1038,"#version %d %s\n",(ulong)(uint)version,pcVar8);
        sVar11 = strlen((char *)local_1038);
        builtin_strncpy((char *)((long)local_1038 + sVar11),"#define ",8);
        builtin_strncpy(acStack_1030 + sVar11,"VERTEX_SH",9);
        builtin_strncpy(acStack_1029 + sVar11 + 2,"ADER 1\n",8);
        *source = (GLchar *)local_1038;
        bVar4 = djgp__attach_shader(program_00,0x8b31,count,source);
        if (bVar4) goto LAB_00134e67;
      }
LAB_0013523c:
      (*glad_glDeleteProgram)(program_00);
      goto LAB_00135271;
    }
    pcVar8 = "djg_error: glCreateProgram failed\n";
    sVar11 = 0x22;
  }
  fwrite(pcVar8,sVar11,1,_stdout);
  fflush(_stdout);
LAB_00135271:
  free(source);
  return false;
}

Assistant:

DJGDEF bool
djgp_to_gl(
    const djg_program *program,
    int version,
    bool compatible,
    bool link,
    GLuint *gl
) {
    const GLchar **srcv;
    djg_program *it;
    int i, srcc, stages = 0;
    GLuint glprogram;

    DJG_ASSERT(program && gl);

    // prepare sources
    srcc = djgp__count(program) + /* head */1;
    srcv = (const GLchar **)DJG_MALLOC(sizeof(GLchar *) * srcc);

    // set source pointers
    it = program->next;
    i = 1;
    while (it) {
        srcv[i] = it->src;
        it = it->next;
        ++i;
    }

    // look for stages in the last source file
    if (strstr(srcv[srcc-1], "VERTEX_SHADER"))
        stages|= DJGP__STAGE_VERTEX_BIT;
    if (strstr(srcv[srcc-1], "FRAGMENT_SHADER"))
        stages|= DJGP__STAGE_FRAGMENT_BIT;
    if (strstr(srcv[srcc-1], "GEOMETRY_SHADER"))
        stages|= DJGP__STAGE_GEOMETRY_BIT;
    if (strstr(srcv[srcc-1], "TESS_CONTROL_SHADER"))
        stages|= DJGP__STAGE_TESS_CONTROL_BIT;
    if (strstr(srcv[srcc-1], "TESS_EVALUATION_SHADER"))
        stages|= DJGP__STAGE_TESS_EVALUATION_BIT;
    if (strstr(srcv[srcc-1], "COMPUTE_SHADER"))
        stages|= DJGP__STAGE_COMPUTE_BIT;
    if (strstr(srcv[srcc-1], "TASK_SHADER"))
        stages|= DJGP__STAGE_TASK_BIT;
    if (strstr(srcv[srcc-1], "MESH_SHADER"))
        stages|= DJGP__STAGE_MESH_BIT;

    if (!stages) {
        DJG_LOG("djg_error: no shader stage found in source\n");
        DJG_FREE(srcv);
        return false;
    }
    // load program
    glprogram = glCreateProgram();
    if (!glIsProgram(glprogram)) {
        DJG_LOG("djg_error: glCreateProgram failed\n");
        DJG_FREE(srcv);
        return false;
    }

#define DJGP__ATTACH_SHADER(glstage, str, bit)                        \
    if (stages & bit) {                                               \
        char head[DJG__CHAR_BUFFER_SIZE];                             \
        head[0] = '\0';                                               \
                                                                      \
        sprintf(head,                                                 \
                "#version %d %s\n",                                   \
                version,                                              \
                compatible ? "compatibility" : "");                   \
        strcat(head, "#define " str " 1\n");                          \
        srcv[0] = head;                                               \
        if (!djgp__attach_shader(glprogram, glstage, srcc, srcv)) {   \
            glDeleteProgram(glprogram);                               \
            DJG_FREE(srcv);                                           \
            return false;                                             \
        }                                                             \
    }
    DJGP__ATTACH_SHADER(GL_VERTEX_SHADER, "VERTEX_SHADER", DJGP__STAGE_VERTEX_BIT);
    DJGP__ATTACH_SHADER(GL_FRAGMENT_SHADER, "FRAGMENT_SHADER", DJGP__STAGE_FRAGMENT_BIT);
#if defined(GL_GEOMETRY_SHADER)
    DJGP__ATTACH_SHADER(GL_GEOMETRY_SHADER, "GEOMETRY_SHADER", DJGP__STAGE_GEOMETRY_BIT);
#endif
#if defined(GL_TESS_CONTROL_SHADER)
    DJGP__ATTACH_SHADER(GL_TESS_CONTROL_SHADER, "TESS_CONTROL_SHADER", DJGP__STAGE_TESS_CONTROL_BIT);
#endif
#if defined(GL_TESS_EVALUATION_SHADER)
    DJGP__ATTACH_SHADER(GL_TESS_EVALUATION_SHADER, "TESS_EVALUATION_SHADER", DJGP__STAGE_TESS_EVALUATION_BIT);
#endif
#if defined(GL_COMPUTE_SHADER)
    DJGP__ATTACH_SHADER(GL_COMPUTE_SHADER, "COMPUTE_SHADER", DJGP__STAGE_COMPUTE_BIT);
#endif
#if defined(GL_TASK_SHADER_NV)
    DJGP__ATTACH_SHADER(GL_TASK_SHADER_NV, "TASK_SHADER", DJGP__STAGE_TASK_BIT);
#endif
#if defined(GL_MESH_SHADER_NV)
    DJGP__ATTACH_SHADER(GL_MESH_SHADER_NV, "MESH_SHADER", DJGP__STAGE_MESH_BIT);
#endif

#undef DJGP__ATTACH_SHADER

    // link if requested
    if (link) {
        GLint link_status = 0;

        glLinkProgram(glprogram);
        glGetProgramiv(glprogram, GL_LINK_STATUS, &link_status);
        if (!link_status) {
            GLint logc = 0;
            GLchar *logv = NULL;

            glGetProgramiv(glprogram, GL_INFO_LOG_LENGTH, &logc);
            logv = (GLchar *)DJG_MALLOC(logc);
            glGetProgramInfoLog(glprogram, logc, NULL, logv);
            DJG_LOG("djg_error: GLSL linker failure\n\
                     -- Begin -- GLSL Linker Info Log\n\
                     %s\n\
                     -- End -- GLSL Linker Info Log\n", logv);
            glDeleteProgram(glprogram);
            DJG_FREE(logv);
            DJG_FREE(srcv);
            return false;
        }
    }

    // cleanup
    DJG_FREE(srcv);
    // affect program
    if (glIsProgram (*gl)) glDeleteProgram(*gl);
    *gl = glprogram;

    return true;
}